

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngframe.cpp
# Opt level: O0

void __thiscall
apngasm::APNGFrame::APNGFrame
          (APNGFrame *this,rgb *pixels,uint width,uint height,rgb *trns_color,uint delayNum,
          uint delayDen)

{
  undefined1 auVar1 [16];
  uchar *puVar2;
  ulong uVar3;
  uchar **ppuVar4;
  int iVar5;
  uint local_34;
  uint i;
  png_uint_32 rowbytes;
  uint delayNum_local;
  rgb *trns_color_local;
  uint height_local;
  uint width_local;
  rgb *pixels_local;
  APNGFrame *this_local;
  
  this->_pixels = (uchar *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_colorType = '\0';
  this->_paletteSize = 0;
  this->_transparencySize = 0;
  this->_delayNum = delayNum;
  this->_delayDen = delayDen;
  this->_rows = (uchar **)0x0;
  memset(this->_palette,0,0x300);
  memset(this->_transparency,0,0x100);
  if (pixels != (rgb *)0x0) {
    iVar5 = width * 3;
    this->_width = width;
    this->_height = height;
    this->_colorType = '\x02';
    puVar2 = (uchar *)operator_new__((ulong)(this->_height * iVar5));
    this->_pixels = puVar2;
    auVar1 = ZEXT416(this->_height) * (undefined1  [16])0x8 * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppuVar4 = (uchar **)operator_new__(uVar3);
    this->_rows = ppuVar4;
    memcpy(this->_pixels,pixels,(ulong)(this->_height * iVar5));
    for (local_34 = 0; local_34 < this->_height; local_34 = local_34 + 1) {
      this->_rows[local_34] = this->_pixels + local_34 * iVar5;
    }
    if (trns_color != (rgb *)0x0) {
      this->_transparency[0] = '\0';
      this->_transparency[1] = trns_color->r;
      this->_transparency[2] = '\0';
      this->_transparency[3] = trns_color->g;
      this->_transparency[4] = '\0';
      this->_transparency[5] = trns_color->b;
      this->_transparencySize = 6;
    }
  }
  return;
}

Assistant:

APNGFrame::APNGFrame(rgb *pixels, unsigned int width, unsigned int height,
                     rgb *trns_color, unsigned delayNum, unsigned delayDen)
    : _pixels(NULL), _width(0), _height(0), _colorType(0), _paletteSize(0),
      _transparencySize(0), _delayNum(delayNum), _delayDen(delayDen),
      _rows(NULL) {
  memset(_palette, 0, sizeof(_palette));
  memset(_transparency, 0, sizeof(_transparency));

  if (pixels != NULL) {
    png_uint_32 rowbytes = width * 3;

    _width = width;
    _height = height;
    _colorType = 2;

    _pixels = new unsigned char[_height * rowbytes];
    _rows = new png_bytep[_height * sizeof(png_bytep)];

    memcpy(_pixels, pixels, _height * rowbytes);

    for (unsigned int i = 0; i < _height; ++i)
      _rows[i] = _pixels + i * rowbytes;

    if (trns_color != NULL) {
      _transparency[0] = 0;
      _transparency[1] = trns_color->r;
      _transparency[2] = 0;
      _transparency[3] = trns_color->g;
      _transparency[4] = 0;
      _transparency[5] = trns_color->b;
      _transparencySize = 6;
    }
  }
}